

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O3

void prometheus::Gateway::CleanupStalePointers
               (vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *collectables)

{
  pointer ppVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  string *psVar6;
  pointer ppVar7;
  iterator __first;
  pointer ppVar8;
  
  ppVar7 = (collectables->
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (collectables->
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)ppVar1 - (long)ppVar7;
  lVar5 = (lVar3 >> 4) * -0x5555555555555555 >> 2;
  lVar4 = lVar3;
  ppVar8 = ppVar7;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    ppVar8 = ppVar7 + 2;
    do {
      __first._M_current = ppVar8;
      p_Var2 = __first._M_current[-2].first.
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current = __first._M_current + -2;
        goto LAB_00107465;
      }
      p_Var2 = __first._M_current[-1].first.
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current = __first._M_current + -1;
        goto LAB_00107465;
      }
      p_Var2 = ((__first._M_current)->first).
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) goto LAB_00107465;
      p_Var2 = __first._M_current[1].first.
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current = __first._M_current + 1;
        goto LAB_00107465;
      }
      lVar5 = lVar5 + -1;
      lVar4 = lVar4 + -0xc0;
      ppVar8 = __first._M_current + 4;
    } while (1 < lVar5);
    ppVar8 = __first._M_current + 2;
  }
  lVar4 = (lVar4 >> 4) * -0x5555555555555555;
  if (lVar4 == 1) {
LAB_00107441:
    p_Var2 = (ppVar8->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    __first._M_current = ppVar8;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      __first._M_current = ppVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_0010742d:
    p_Var2 = (ppVar8->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    __first._M_current = ppVar8;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      ppVar8 = ppVar8 + 1;
      goto LAB_00107441;
    }
  }
  else {
    __first._M_current = ppVar1;
    if (lVar4 != 3) goto LAB_001074cb;
    p_Var2 = (ppVar8->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    __first._M_current = ppVar8;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      ppVar8 = ppVar8 + 1;
      goto LAB_0010742d;
    }
  }
LAB_00107465:
  if (__first._M_current + 1 != ppVar1 && __first._M_current != ppVar1) {
    psVar6 = (string *)&__first._M_current[1].second;
    do {
      if ((*(long *)(psVar6 + -8) != 0) && (*(int *)(*(long *)(psVar6 + -8) + 8) != 0)) {
        ::std::__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *)
                   __first._M_current,
                   (__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *)
                   (psVar6 + -0x10));
        ::std::__cxx11::string::operator=((string *)&(__first._M_current)->second,psVar6);
        __first._M_current = __first._M_current + 1;
      }
      ppVar7 = (pointer)(psVar6 + 0x20);
      psVar6 = psVar6 + 0x30;
    } while (ppVar7 != ppVar1);
    ppVar7 = (collectables->
             super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(collectables->
                  super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar7;
  }
LAB_001074cb:
  ::std::
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase(collectables,__first,
             (pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&(ppVar7->first).
                        super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + lVar3));
  return;
}

Assistant:

void Gateway::CleanupStalePointers(
    std::vector<CollectableEntry>& collectables) {
  collectables.erase(
      std::remove_if(std::begin(collectables), std::end(collectables),
                     [](const CollectableEntry& candidate) {
                       return candidate.first.expired();
                     }),
      std::end(collectables));
}